

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RemoveUnusedModuleElements.cpp
# Opt level: O2

bool __thiscall wasm::Analyzer::processExpressions(Analyzer *this)

{
  pointer ppEVar1;
  Expression *curr;
  undefined8 uVar2;
  undefined4 uVar3;
  pointer ppVar4;
  pointer pHVar5;
  pointer pNVar6;
  pointer ppVar7;
  bool bVar8;
  Module *pMVar9;
  pointer ppVar10;
  pointer pNVar11;
  pointer ppVar12;
  StructField structField;
  undefined1 auStack_188 [8];
  ReferenceFinder finder;
  
  bVar8 = false;
  while (ppEVar1 = (this->expressionQueue).
                   super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>.
                   _M_impl.super__Vector_impl_data._M_finish,
        ppEVar1 !=
        (this->expressionQueue).
        super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>._M_impl.
        super__Vector_impl_data._M_start) {
    curr = ppEVar1[-1];
    (this->expressionQueue).
    super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>._M_impl.
    super__Vector_impl_data._M_finish = ppEVar1 + -1;
    auStack_188 = (undefined1  [8])0x0;
    finder.super_PostWalker<wasm::ReferenceFinder,_wasm::Visitor<wasm::ReferenceFinder,_void>_>.
    super_Walker<wasm::ReferenceFinder,_wasm::Visitor<wasm::ReferenceFinder,_void>_>.replacep =
         (Expression **)0x0;
    memset((Expression ***)
           ((long)(finder.
                   super_PostWalker<wasm::ReferenceFinder,_wasm::Visitor<wasm::ReferenceFinder,_void>_>
                   .super_Walker<wasm::ReferenceFinder,_wasm::Visitor<wasm::ReferenceFinder,_void>_>
                   .stack.fixed._M_elems + 9) + 8),0,0x88);
    finder.super_PostWalker<wasm::ReferenceFinder,_wasm::Visitor<wasm::ReferenceFinder,_void>_>.
    super_Walker<wasm::ReferenceFinder,_wasm::Visitor<wasm::ReferenceFinder,_void>_>.currFunction =
         (Function *)this->module;
    Visitor<wasm::ReferenceFinder,_void>::visit
              ((Visitor<wasm::ReferenceFinder,_void> *)auStack_188,curr);
    ppVar4 = finder.elements.
             super__Vector_base<std::pair<wasm::ModuleElementKind,_wasm::Name>,_std::allocator<std::pair<wasm::ModuleElementKind,_wasm::Name>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    for (pMVar9 = finder.
                  super_PostWalker<wasm::ReferenceFinder,_wasm::Visitor<wasm::ReferenceFinder,_void>_>
                  .super_Walker<wasm::ReferenceFinder,_wasm::Visitor<wasm::ReferenceFinder,_void>_>.
                  currModule;
        pHVar5 = finder.callRefTypes.
                 super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>._M_impl.
                 super__Vector_impl_data._M_start,
        ppVar10 = finder.elements.
                  super__Vector_base<std::pair<wasm::ModuleElementKind,_wasm::Name>,_std::allocator<std::pair<wasm::ModuleElementKind,_wasm::Name>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage, pMVar9 != (Module *)ppVar4;
        pMVar9 = (Module *)&pMVar9->functions) {
      use(this,(ModuleElement)
               (pMVar9->exports).
               super__Vector_base<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
               ._M_impl.super__Vector_impl_data);
    }
    for (; pNVar6 = finder.refFuncs.super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>.
                    _M_impl.super__Vector_impl_data._M_start,
        pNVar11 = (pointer)finder.callRefTypes.
                           super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>.
                           _M_impl.super__Vector_impl_data._M_end_of_storage,
        ppVar10 != (pointer)pHVar5; ppVar10 = (pointer)&ppVar10->second) {
      useCallRefType(this,(HeapType)*(uintptr_t *)ppVar10);
    }
    for (; ppVar7 = finder.structFields.
                    super__Vector_base<std::pair<wasm::HeapType,_unsigned_int>,_std::allocator<std::pair<wasm::HeapType,_unsigned_int>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
        ppVar12 = (pointer)finder.refFuncs.
                           super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>._M_impl.
                           super__Vector_impl_data._M_end_of_storage, pNVar11 != pNVar6;
        pNVar11 = pNVar11 + 1) {
      useRefFunc(this,(Name)(pNVar11->super_IString).str);
    }
    for (; ppVar12 != ppVar7; ppVar12 = ppVar12 + 1) {
      uVar2 = ppVar12->first;
      uVar3 = ppVar12->second;
      structField.second = uVar3;
      structField.first.id = uVar2;
      structField._12_4_ = 0;
      useStructField(this,structField);
    }
    scanChildren(this,curr);
    ReferenceFinder::~ReferenceFinder((ReferenceFinder *)auStack_188);
    bVar8 = true;
  }
  return bVar8;
}

Assistant:

bool processExpressions() {
    bool worked = false;
    while (expressionQueue.size()) {
      worked = true;

      auto* curr = expressionQueue.back();
      expressionQueue.pop_back();

      // Find references in this expression, and apply them. Anything found here
      // is used.
      ReferenceFinder finder;
      finder.setModule(module);
      finder.visit(curr);
      for (auto element : finder.elements) {
        use(element);
      }
      for (auto type : finder.callRefTypes) {
        useCallRefType(type);
      }
      for (auto func : finder.refFuncs) {
        useRefFunc(func);
      }
      for (auto structField : finder.structFields) {
        useStructField(structField);
      }

      // Scan the children to continue our work.
      scanChildren(curr);
    }
    return worked;
  }